

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void Fra_ClausSimInfoClean(Clu_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  pVVar2 = p->vCexes;
  if (p->pCnf->nVars <= pVVar2->nSize) {
    if (0 < pVVar2->nSize) {
      iVar1 = p->nCexesAlloc;
      iVar3 = iVar1 + 0x1f;
      if (-1 < iVar1) {
        iVar3 = iVar1;
      }
      lVar4 = 0;
      do {
        memset(pVVar2->pArray[lVar4],0,(long)((iVar3 >> 5) << 2));
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    p->nCexes = 0;
    return;
  }
  __assert_fail("p->pCnf->nVars <= Vec_PtrSize(p->vCexes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                ,0x3e1,"void Fra_ClausSimInfoClean(Clu_Man_t *)");
}

Assistant:

void Fra_ClausSimInfoClean( Clu_Man_t * p )
{
    assert( p->pCnf->nVars <= Vec_PtrSize(p->vCexes) );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    p->nCexes = 0;
}